

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void generate_skipper(CodeGeneratorData *codegen,int32_t skip_bytes,bool force_global_offset)

{
  bool bVar1;
  undefined3 in_register_00000011;
  uint32_t value;
  BinaryWriter *this;
  
  value = skip_bytes + (int)(codegen->bw).offset + (int)codegen->script_offset;
  if (CONCAT31(in_register_00000011,force_global_offset) == 0) {
    if ((codegen->program->opt).use_local_offsets == false) {
      bVar1 = Script::uses_local_offsets
                        ((codegen->script).
                         super___shared_ptr<const_Script,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (!bVar1) goto LAB_00156a42;
    }
    value = -value;
  }
LAB_00156a42:
  this = &codegen->bw;
  BinaryWriter::emplace_u8(this,'\x02');
  BinaryWriter::emplace_u8(this,'\0');
  BinaryWriter::emplace_u8(this,'\x01');
  BinaryWriter::emplace_u32(this,value);
  return;
}

Assistant:

static void generate_skipper(CodeGeneratorData& codegen, int32_t skip_bytes, bool force_global_offset)//+8 +12
{
    int32_t target = skip_bytes + codegen.bw.current_offset() + codegen.script_offset;

    if(!force_global_offset)
    {
        if(codegen.program.opt.use_local_offsets || codegen.script->uses_local_offsets())
        {
            target = -target;
        }
    }

    codegen.bw.emplace_u16(0x0002);
    codegen.bw.emplace_u8(1);
    codegen.bw.emplace_i32(target);
}